

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemBufFormatTarget.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::MemBufFormatTarget::MemBufFormatTarget
          (MemBufFormatTarget *this,XMLSize_t initCapacity,MemoryManager *manager)

{
  int iVar1;
  undefined4 extraout_var;
  MemoryManager *manager_local;
  XMLSize_t initCapacity_local;
  MemBufFormatTarget *this_local;
  
  XMLFormatTarget::XMLFormatTarget(&this->super_XMLFormatTarget);
  (this->super_XMLFormatTarget)._vptr_XMLFormatTarget =
       (_func_int **)&PTR__MemBufFormatTarget_0052d760;
  this->fMemoryManager = manager;
  this->fDataBuf = (XMLByte *)0x0;
  this->fIndex = 0;
  this->fCapacity = initCapacity;
  iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,this->fCapacity + 4);
  this->fDataBuf = (XMLByte *)CONCAT44(extraout_var,iVar1);
  *this->fDataBuf = '\0';
  return;
}

Assistant:

MemBufFormatTarget::MemBufFormatTarget( XMLSize_t            initCapacity
                                      , MemoryManager* const manager)
    : fMemoryManager(manager)
    , fDataBuf(0)
    , fIndex(0)
    , fCapacity(initCapacity)
{
    // Buffer is one larger than capacity, to allow for zero term
    fDataBuf = (XMLByte*) fMemoryManager->allocate
    (
        (fCapacity + 4) * sizeof(XMLByte)
    );//new XMLByte[fCapacity+4];

    // Keep it null terminated
    fDataBuf[0] = XMLByte(0);
}